

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
astar::Map::Map(Map *this,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *map)

{
  size_type sVar1;
  reference this_00;
  int local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *map_local;
  Map *this_local;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->map);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->map,map);
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(&this->map);
  this->n = (int)sVar1;
  if (this->n < 1) {
    local_40 = 0;
  }
  else {
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->map,0);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(this_00);
    local_40 = (int)sVar1;
  }
  this->m = local_40;
  return;
}

Assistant:

Map::Map(const std::vector<std::vector<int>>& map)
{
    this->map = map;
    n = this->map.size();
    m = (n > 0 ? this->map[0].size() : 0);
}